

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::log<char[20],unsigned_long,char[8]>
          (ConsoleLogger *this,char (*args) [20],unsigned_long *args_1,char (*args_2) [8])

{
  mutex *in_RCX;
  char (*in_RDX) [20];
  ConsoleLogger *in_RSI;
  char (*in_RDI) [8];
  
  if (*(int *)(in_RDI[0xd] + 4) < 1) {
    std::mutex::lock(in_RCX);
    std::operator<<((ostream *)*in_RDI,"    ");
    print<char[20],unsigned_long,char[8]>(in_RSI,in_RDX,(unsigned_long *)in_RCX,in_RDI);
    std::mutex::unlock((mutex *)0x1156f4);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}